

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

ssize_t zip_entry_read(zip_t *zip,void **buf,size_t *bufsize)

{
  mz_bool mVar1;
  void *pvVar2;
  zip_t *local_40;
  size_t size;
  zip_t *pzStack_30;
  mz_uint idx;
  mz_zip_archive *pzip;
  size_t *bufsize_local;
  void **buf_local;
  zip_t *zip_local;
  
  local_40 = (zip_t *)0x0;
  if (zip == (zip_t *)0x0) {
    zip_local = (zip_t *)0xffffffffffffffff;
  }
  else if (((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING) && (-1 < (zip->entry).index)) {
    size._4_4_ = (mz_uint)(zip->entry).index;
    pzStack_30 = zip;
    pzip = (mz_zip_archive *)bufsize;
    bufsize_local = (size_t *)buf;
    buf_local = (void **)zip;
    mVar1 = mz_zip_reader_is_file_a_directory(&zip->archive,size._4_4_);
    if (mVar1 == 0) {
      pvVar2 = mz_zip_reader_extract_to_heap(&pzStack_30->archive,size._4_4_,(size_t *)&local_40,0);
      *bufsize_local = (size_t)pvVar2;
      if ((*bufsize_local != 0) && (pzip != (mz_zip_archive *)0x0)) {
        pzip->m_archive_size = (mz_uint64)local_40;
      }
      zip_local = local_40;
    }
    else {
      zip_local = (zip_t *)0xffffffffffffffef;
    }
  }
  else {
    zip_local = (zip_t *)0xfffffffffffffffd;
  }
  return (ssize_t)zip_local;
}

Assistant:

ssize_t zip_entry_read(struct zip_t *zip, void **buf, size_t *bufsize) {
  mz_zip_archive *pzip = NULL;
  mz_uint idx;
  size_t size = 0;

  if (!zip) {
    // zip_t handler is not initialized
    return (ssize_t)ZIP_ENOINIT;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode != MZ_ZIP_MODE_READING ||
      zip->entry.index < (ssize_t)0) {
    // the entry is not found or we do not have read access
    return (ssize_t)ZIP_ENOENT;
  }

  idx = (mz_uint)zip->entry.index;
  if (mz_zip_reader_is_file_a_directory(pzip, idx)) {
    // the entry is a directory
    return (ssize_t)ZIP_EINVENTTYPE;
  }

  *buf = mz_zip_reader_extract_to_heap(pzip, idx, &size, 0);
  if (*buf && bufsize) {
    *bufsize = size;
  }
  return (ssize_t)size;
}